

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>
fmt::v5::internal::
format_decimal<char,unsigned_long,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,fmt::v5::internal::no_thousands_sep>
          (char *param_1,undefined8 param_2,undefined4 param_3)

{
  type tVar1;
  char *end;
  char_type buffer [26];
  char *in_stack_ffffffffffffff98;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> in_stack_ffffffffffffffa8;
  undefined1 local_48 [36];
  undefined4 local_24;
  undefined8 local_20;
  char *local_10;
  
  local_24 = param_3;
  local_20 = param_2;
  local_10 = param_1;
  format_decimal<unsigned_long,char,fmt::v5::internal::no_thousands_sep>(local_48,param_2,param_3);
  tVar1 = copy_str<char,char*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (local_10,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa8);
  return (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)tVar1.container;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}